

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMf.c
# Opt level: O1

Gia_Man_t * Mf_ManDeriveMapping(Mf_Man_t *p)

{
  uint uVar1;
  int iVar2;
  Jf_Par_t *pJVar3;
  void *pvVar4;
  Vec_Int_t *p_00;
  int *piVar5;
  Gia_Man_t *pGVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  
  pJVar3 = p->pPars;
  if ((pJVar3->fCutMin != 0) || (p->pGia->vMapping != (Vec_Int_t *)0x0)) {
    __assert_fail("!p->pPars->fCutMin && p->pGia->vMapping == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaMf.c"
                  ,0x495,"Gia_Man_t *Mf_ManDeriveMapping(Mf_Man_t *)");
  }
  uVar1 = p->pGia->nObjs;
  iVar8 = (int)pJVar3->Edge + uVar1;
  iVar2 = (int)pJVar3->Area;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar10 = 0x10;
  if (0xe < (iVar8 + iVar2 * 2) - 1U) {
    iVar10 = iVar8 + iVar2 * 2;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar10;
  if (iVar10 == 0) {
    piVar5 = (int *)0x0;
  }
  else {
    piVar5 = (int *)malloc((long)iVar10 << 2);
  }
  p_00->pArray = piVar5;
  if (iVar10 < (int)uVar1) {
    if (piVar5 == (int *)0x0) {
      piVar5 = (int *)malloc((long)(int)uVar1 << 2);
    }
    else {
      piVar5 = (int *)realloc(piVar5,(long)(int)uVar1 << 2);
    }
    p_00->pArray = piVar5;
    if (piVar5 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    p_00->nCap = uVar1;
  }
  if (0 < (int)uVar1) {
    memset(p_00->pArray,0,(ulong)uVar1 * 4);
  }
  p_00->nSize = uVar1;
  pGVar6 = p->pGia;
  if (0 < pGVar6->nObjs) {
    lVar12 = 0;
    do {
      if ((~*(uint *)(pGVar6->pObjs + lVar12) & 0x1fffffff) != 0 &&
          -1 < (int)*(uint *)(pGVar6->pObjs + lVar12)) {
        if (0xffff < *(uint *)&p->pLfObjs[lVar12].field_0xc) {
          uVar1 = p->pLfObjs[lVar12].iCutSet;
          uVar7 = (int)uVar1 >> 0x10;
          if (((int)uVar7 < 0) || ((p->vPages).nSize <= (int)uVar7)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          if (p_00->nSize <= lVar12) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          pvVar4 = (p->vPages).pArray[uVar7];
          uVar11 = (ulong)(uVar1 & 0xffff);
          p_00->pArray[lVar12] = p_00->nSize;
          Vec_IntPush(p_00,*(uint *)((long)pvVar4 + uVar11 * 4 + 4) & 0x1f);
          if ((*(byte *)((long)pvVar4 + uVar11 * 4 + 4) & 0x1f) != 0) {
            uVar9 = 0;
            do {
              Vec_IntPush(p_00,*(int *)((long)pvVar4 + uVar9 * 4 + uVar11 * 4 + 8));
              uVar9 = uVar9 + 1;
            } while (uVar9 < (*(uint *)((long)pvVar4 + uVar11 * 4 + 4) & 0x1f));
          }
          Vec_IntPush(p_00,(int)lVar12);
        }
      }
      lVar12 = lVar12 + 1;
      pGVar6 = p->pGia;
    } while (lVar12 < pGVar6->nObjs);
  }
  if ((p_00->nCap != 0x10) && (p_00->nSize != p_00->nCap)) {
    __assert_fail("Vec_IntCap(vMapping) == 16 || Vec_IntSize(vMapping) == Vec_IntCap(vMapping)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaMf.c"
                  ,0x4a3,"Gia_Man_t *Mf_ManDeriveMapping(Mf_Man_t *)");
  }
  pGVar6->vMapping = p_00;
  return pGVar6;
}

Assistant:

Gia_Man_t * Mf_ManDeriveMapping( Mf_Man_t * p )
{
    Vec_Int_t * vMapping;
    int i, k, * pCut;
    assert( !p->pPars->fCutMin && p->pGia->vMapping == NULL );
    vMapping = Vec_IntAlloc( Gia_ManObjNum(p->pGia) + (int)p->pPars->Edge + (int)p->pPars->Area * 2 );
    Vec_IntFill( vMapping, Gia_ManObjNum(p->pGia), 0 );
    Gia_ManForEachAndId( p->pGia, i )
    {
        if ( !Mf_ObjMapRefNum(p, i) )
            continue;
        pCut = Mf_ObjCutBest( p, i );
        Vec_IntWriteEntry( vMapping, i, Vec_IntSize(vMapping) );
        Vec_IntPush( vMapping, Mf_CutSize(pCut) );
        for ( k = 1; k <= Mf_CutSize(pCut); k++ )
            Vec_IntPush( vMapping, pCut[k] );
        Vec_IntPush( vMapping, i );
    }
    assert( Vec_IntCap(vMapping) == 16 || Vec_IntSize(vMapping) == Vec_IntCap(vMapping) );
    p->pGia->vMapping = vMapping;
    return p->pGia;
}